

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

Cba_Man_t *
Cba_ManAlloc(char *pFileName,int nNtks,Abc_Nam_t *pStrs,Abc_Nam_t *pFuns,Abc_Nam_t *pMods,
            Hash_IntMan_t *vHash)

{
  uint nSize;
  ulong uVar1;
  uint uVar2;
  Cba_Man_t *pCVar3;
  char *pcVar4;
  Abc_Nam_t *p;
  Vec_Int_t *pVVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  
  pCVar3 = (Cba_Man_t *)calloc(1,0x658);
  pcVar4 = Extra_FileDesignName(pFileName);
  pCVar3->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(pFileName);
  pCVar3->pSpec = pcVar4;
  if (pStrs == (Abc_Nam_t *)0x0) {
    pStrs = Abc_NamStart(1000,0x18);
  }
  pCVar3->pStrs = pStrs;
  p = pFuns;
  if (pFuns == (Abc_Nam_t *)0x0) {
    p = Abc_NamStart(100,0x18);
  }
  pCVar3->pFuns = p;
  if (pMods == (Abc_Nam_t *)0x0) {
    pMods = Abc_NamStart(100,0x18);
  }
  pCVar3->pMods = pMods;
  if (vHash != (Hash_IntMan_t *)0x0) {
LAB_002e1766:
    pCVar3->vHash = vHash;
    if (pFuns == (Abc_Nam_t *)0x0) {
      Abc_NamStrFindOrAdd(p,"1\'b0",(int *)0x0);
      Abc_NamStrFindOrAdd(p,"1\'b1",(int *)0x0);
      Abc_NamStrFindOrAdd(p,"1\'bx",(int *)0x0);
      Abc_NamStrFindOrAdd(p,"1\'bz",(int *)0x0);
    }
    Vec_PtrGrow(&pCVar3->vNtks,nNtks + 1);
    Vec_PtrPush(&pCVar3->vNtks,(void *)0x0);
    pCVar3->iRoot = 1;
    return pCVar3;
  }
  vHash = (Hash_IntMan_t *)calloc(1,0x18);
  uVar8 = 1099;
  do {
    do {
      nSize = uVar8 + 1;
      uVar2 = uVar8 & 1;
      uVar8 = nSize;
    } while (uVar2 != 0);
    uVar7 = 3;
    do {
      iVar6 = (int)uVar7;
      if (nSize < (uint)(iVar6 * iVar6)) {
        pVVar5 = Vec_IntStart(nSize);
        vHash->vTable = pVVar5;
        pVVar5 = Vec_IntAlloc(0x1130);
        vHash->vObjs = pVVar5;
        Vec_IntFill(pVVar5,4,0);
        vHash->nRefs = 1;
        goto LAB_002e1766;
      }
      uVar1 = (ulong)nSize % uVar7;
      uVar7 = (ulong)(iVar6 + 2);
    } while ((int)uVar1 != 0);
  } while( true );
}

Assistant:

static inline Cba_Man_t * Cba_ManAlloc( char * pFileName, int nNtks, Abc_Nam_t * pStrs, Abc_Nam_t * pFuns, Abc_Nam_t * pMods, Hash_IntMan_t * vHash )
{
    Cba_Man_t * pNew = ABC_CALLOC( Cba_Man_t, 1 );
    pNew->pName = Extra_FileDesignName( pFileName );
    pNew->pSpec = Abc_UtilStrsav( pFileName );
    pNew->pStrs = pStrs ? pStrs : Abc_NamStart( 1000, 24 );
    pNew->pFuns = pFuns ? pFuns : Abc_NamStart( 100, 24 );
    pNew->pMods = pMods ? pMods : Abc_NamStart( 100, 24 );
    pNew->vHash = vHash ? vHash : Hash_IntManStart( 1000 );
    if ( pFuns == NULL )
    {
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'b0", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'b1", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'bx", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'bz", NULL);
    }
//    if ( vHash == NULL )
//        Hash_Int2ManInsert( pNew->vHash, 0, 0, 0 );
    Vec_PtrGrow( &pNew->vNtks,  nNtks+1 ); Vec_PtrPush( &pNew->vNtks, NULL );
    // set default root module
    pNew->iRoot = 1;
    return pNew;
}